

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomposer.cpp
# Opt level: O2

void test(int gid,ContinuousBounds *param_2,ContinuousBounds *bounds,ContinuousBounds *param_4,
         RegularContinuousLink *param_5)

{
  pointer pfVar1;
  IResultCapture *pIVar2;
  long lVar3;
  float *pfVar4;
  AssertionHandler local_d8;
  ContinuousBounds *local_90;
  undefined **local_88;
  undefined1 local_80;
  undefined1 local_7f;
  float *local_78;
  char *local_70;
  undefined8 local_68;
  Approx *local_60;
  int local_54;
  Approx local_50;
  
  local_d8.m_assertionInfo.macroName.m_start = "REQUIRE";
  local_d8.m_assertionInfo.macroName.m_size = 7;
  local_d8.m_assertionInfo.lineInfo.file =
       "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/decomposer.cpp";
  local_d8.m_assertionInfo.lineInfo.line = 0xd;
  local_d8.m_assertionInfo.capturedExpression.m_start = "gid == 0";
  local_d8.m_assertionInfo.capturedExpression.m_size = 8;
  local_d8.m_assertionInfo.resultDisposition = Normal;
  local_d8.m_reaction.shouldDebugBreak = false;
  local_d8.m_reaction.shouldThrow = false;
  local_d8.m_completed = false;
  local_90 = bounds;
  local_54 = gid;
  local_d8.m_resultCapture = Catch::getResultCapture();
  local_60 = &local_50;
  local_50.m_epsilon = (double)((ulong)local_50.m_epsilon._4_4_ << 0x20);
  local_7f = gid == 0;
  local_80 = 1;
  local_88 = &PTR_streamReconstructedExpression_00193908;
  local_70 = "==";
  local_68 = 2;
  local_78 = (float *)&local_54;
  (*(local_d8.m_resultCapture)->_vptr_IResultCapture[10])
            (local_d8.m_resultCapture,&local_d8,&local_88,&local_d8.m_reaction);
  Catch::AssertionHandler::complete(&local_d8);
  Catch::AssertionHandler::~AssertionHandler(&local_d8);
  for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 4) {
    local_d8.m_assertionInfo.macroName.m_start = "REQUIRE";
    local_d8.m_assertionInfo.macroName.m_size = 7;
    local_d8.m_assertionInfo.lineInfo.file =
         "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/decomposer.cpp";
    local_d8.m_assertionInfo.lineInfo.line = 0xf;
    local_d8.m_assertionInfo.capturedExpression.m_start = "bounds.min[i] == 0";
    local_d8.m_assertionInfo.capturedExpression.m_size = 0x12;
    local_d8.m_assertionInfo.resultDisposition = Normal;
    local_d8.m_reaction.shouldDebugBreak = false;
    local_d8.m_reaction.shouldThrow = false;
    local_d8.m_completed = false;
    local_d8.m_resultCapture = Catch::getResultCapture();
    pfVar1 = (local_90->min).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin;
    local_50.m_epsilon = (double)((ulong)local_50.m_epsilon & 0xffffffff00000000);
    local_7f = *(float *)((long)pfVar1 + lVar3) == 0.0;
    local_78 = (float *)((long)pfVar1 + lVar3);
    local_80 = 1;
    local_88 = &PTR_streamReconstructedExpression_00193948;
    local_70 = "==";
    local_68 = 2;
    local_60 = &local_50;
    (*(local_d8.m_resultCapture)->_vptr_IResultCapture[10])
              (local_d8.m_resultCapture,&local_d8,&local_88,&local_d8.m_reaction);
    Catch::AssertionHandler::complete(&local_d8);
    Catch::AssertionHandler::~AssertionHandler(&local_d8);
  }
  local_d8.m_assertionInfo.macroName.m_start = "REQUIRE";
  local_d8.m_assertionInfo.macroName.m_size = 7;
  local_d8.m_assertionInfo.lineInfo.file =
       "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/decomposer.cpp";
  local_d8.m_assertionInfo.lineInfo.line = 0x10;
  local_d8.m_assertionInfo.capturedExpression.m_start = "bounds.max[0] == Approx(33.333)";
  local_d8.m_assertionInfo.capturedExpression.m_size = 0x1f;
  local_d8.m_assertionInfo.resultDisposition = Normal;
  local_d8.m_reaction.shouldDebugBreak = false;
  local_d8.m_reaction.shouldThrow = false;
  local_d8.m_completed = false;
  local_d8.m_resultCapture = Catch::getResultCapture();
  pfVar4 = (local_90->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin;
  local_50.m_epsilon = 1.1920928955078125e-05;
  local_50.m_margin = 0.0;
  local_50.m_scale = 0.0;
  local_50.m_value = 33.333;
  local_7f = Catch::Detail::operator==(pfVar4,&local_50);
  local_80 = 1;
  local_88 = &PTR_streamReconstructedExpression_00193988;
  local_70 = "==";
  local_68 = 2;
  local_78 = pfVar4;
  local_60 = &local_50;
  (*(local_d8.m_resultCapture)->_vptr_IResultCapture[10])(local_d8.m_resultCapture,&local_d8);
  Catch::AssertionHandler::complete(&local_d8);
  Catch::AssertionHandler::~AssertionHandler(&local_d8);
  local_d8.m_assertionInfo.macroName.m_start = "REQUIRE";
  local_d8.m_assertionInfo.macroName.m_size = 7;
  local_d8.m_assertionInfo.lineInfo.file =
       "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/decomposer.cpp";
  local_d8.m_assertionInfo.lineInfo.line = 0x11;
  local_d8.m_assertionInfo.capturedExpression.m_start = "bounds.max[1] == Approx(33.333)";
  local_d8.m_assertionInfo.capturedExpression.m_size = 0x1f;
  local_d8.m_assertionInfo.resultDisposition = Normal;
  local_d8.m_reaction.shouldDebugBreak = false;
  local_d8.m_reaction.shouldThrow = false;
  local_d8.m_completed = false;
  pIVar2 = Catch::getResultCapture();
  pfVar4 = (local_90->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin + 1;
  local_50.m_epsilon = 1.1920928955078125e-05;
  local_50.m_margin = 0.0;
  local_50.m_scale = 0.0;
  local_50.m_value = 33.333;
  local_d8.m_resultCapture = pIVar2;
  local_7f = Catch::Detail::operator==(pfVar4,&local_50);
  local_80 = 1;
  local_88 = &PTR_streamReconstructedExpression_00193988;
  local_70 = "==";
  local_68 = 2;
  local_78 = pfVar4;
  local_60 = &local_50;
  (*pIVar2->_vptr_IResultCapture[10])(pIVar2,&local_d8,&local_88,&local_d8.m_reaction);
  Catch::AssertionHandler::complete(&local_d8);
  Catch::AssertionHandler::~AssertionHandler(&local_d8);
  local_d8.m_assertionInfo.macroName.m_start = "REQUIRE";
  local_d8.m_assertionInfo.macroName.m_size = 7;
  local_d8.m_assertionInfo.lineInfo.file =
       "/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/tests/decomposer.cpp";
  local_d8.m_assertionInfo.lineInfo.line = 0x12;
  local_d8.m_assertionInfo.capturedExpression.m_start = "bounds.max[2] == 100.";
  local_d8.m_assertionInfo.capturedExpression.m_size = 0x15;
  local_d8.m_assertionInfo.resultDisposition = Normal;
  local_d8.m_reaction.shouldDebugBreak = false;
  local_d8.m_reaction.shouldThrow = false;
  local_d8.m_completed = false;
  local_d8.m_resultCapture = Catch::getResultCapture();
  pfVar1 = (local_90->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin;
  local_50.m_epsilon = 100.0;
  local_78 = pfVar1 + 2;
  local_7f = pfVar1[2] == 100.0;
  local_80 = 1;
  local_88 = &PTR_streamReconstructedExpression_001939c8;
  local_70 = "==";
  local_68 = 2;
  local_60 = &local_50;
  (*(local_d8.m_resultCapture)->_vptr_IResultCapture[10])
            (local_d8.m_resultCapture,&local_d8,&local_88,&local_d8.m_reaction);
  Catch::AssertionHandler::complete(&local_d8);
  Catch::AssertionHandler::~AssertionHandler(&local_d8);
  return;
}

Assistant:

void  test(int gid,                                         // block global id
           const diy::ContinuousBounds&,                    // block bounds without any ghost added
           const diy::ContinuousBounds& bounds,             // block bounds including ghost region
           const diy::ContinuousBounds&,                    // global data bounds
           const diy::RegularContinuousLink&)               // neighborhood
{
    REQUIRE(gid == 0);
    for (int i = 0; i < 3; ++i)
        REQUIRE(bounds.min[i] == 0);
    REQUIRE(bounds.max[0] == Approx(33.333));
    REQUIRE(bounds.max[1] == Approx(33.333));
    REQUIRE(bounds.max[2] == 100.);
}